

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDebugReportUtil.cpp
# Opt level: O0

VkBool32 vk::anon_unknown_0::debugReportCallback
                   (VkDebugReportFlagsEXT flags,VkDebugReportObjectTypeEXT objectType,
                   deUint64 object,size_t location,deInt32 messageCode,char *pLayerPrefix,
                   char *pMessage,void *pUserData)

{
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_b9;
  string local_b8;
  DebugReportMessage local_98;
  void *local_38;
  MessageList *messageList;
  char *pLayerPrefix_local;
  size_t sStack_20;
  deInt32 messageCode_local;
  size_t location_local;
  deUint64 object_local;
  VkDebugReportObjectTypeEXT objectType_local;
  VkDebugReportFlagsEXT flags_local;
  
  local_38 = pUserData;
  messageList = (MessageList *)pLayerPrefix;
  pLayerPrefix_local._4_4_ = messageCode;
  sStack_20 = location;
  location_local = object;
  object_local._0_4_ = objectType;
  object_local._4_4_ = flags;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pLayerPrefix,&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pMessage,&local_f1);
  DebugReportMessage::DebugReportMessage
            (&local_98,flags,objectType,object,location,messageCode,&local_b8,&local_f0);
  de::AppendList<vk::DebugReportMessage>::append
            ((AppendList<vk::DebugReportMessage> *)pUserData,&local_98);
  DebugReportMessage::~DebugReportMessage(&local_98);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  return 0;
}

Assistant:

VKAPI_ATTR VkBool32	VKAPI_CALL debugReportCallback (VkDebugReportFlagsEXT		flags,
													VkDebugReportObjectTypeEXT	objectType,
													deUint64					object,
													size_t						location,
													deInt32						messageCode,
													const char*					pLayerPrefix,
													const char*					pMessage,
													void*						pUserData)
{
	DebugReportRecorder::MessageList* const	messageList	= reinterpret_cast<DebugReportRecorder::MessageList*>(pUserData);

	messageList->append(DebugReportMessage(flags, objectType, object, location, messageCode, pLayerPrefix, pMessage));

	// Return false to indicate that the call should not return error and should
	// continue execution normally.
	return VK_FALSE;
}